

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

string_view bloaty::dwarf::AttrValue::ReadBlock<unsigned_short>(string_view *data)

{
  unsigned_short uVar1;
  string_view sVar2;
  string_view sVar3;
  unsigned_short len;
  string_view *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  
  uVar1 = ReadFixed<unsigned_short,2ul>
                    ((string_view *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0));
  sVar2 = ReadBytes(CONCAT26(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  sVar3._M_len = sVar2._M_len;
  sVar3._M_str = sVar2._M_str;
  return sVar3;
}

Assistant:

string_view AttrValue::ReadBlock(string_view* data) {
  D len = ReadFixed<D>(data);
  return ReadBytes(len, data);
}